

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ScaleProgram::ScaleProgram(ScaleProgram *this,Context *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  GLint GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_00;
  Functions *gl;
  ProgramSources local_e8;
  Context *local_18;
  Context *ctx_local;
  ScaleProgram *this_local;
  
  local_18 = ctx;
  ctx_local = (Context *)this;
  pRVar7 = deqp::gls::LifetimeTests::details::Context::getRenderContext(ctx);
  getSources(&local_e8,this);
  glu::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pRVar7,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  pRVar7 = deqp::gls::LifetimeTests::details::Context::getRenderContext(local_18);
  this->m_renderCtx = pRVar7;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (bVar2 = glu::ShaderProgram::isOk(&this->super_ShaderProgram), bVar2))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0xb48);
      dVar5 = glu::ShaderProgram::getProgram(&this->super_ShaderProgram);
      GVar6 = (*pcVar1)(dVar5,"scale");
      this->m_scaleLoc = GVar6;
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x780);
      dVar5 = glu::ShaderProgram::getProgram(&this->super_ShaderProgram);
      GVar6 = (*pcVar1)(dVar5,"pos");
      this->m_posLoc = GVar6;
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
             ,0x5a);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ScaleProgram::ScaleProgram (lt::Context& ctx)
	: glu::ShaderProgram	(ctx.getRenderContext(), getSources())
	, m_renderCtx			(ctx.getRenderContext())
{
	const Functions& gl = m_renderCtx.getFunctions();
	TCU_CHECK(isOk());
	m_scaleLoc = gl.getUniformLocation(getProgram(), "scale");
	m_posLoc = gl.getAttribLocation(getProgram(), "pos");
}